

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O2

bool __thiscall jrtplib::RTPSources::GotoPreviousSourceWithData(RTPSources *this)

{
  RTPInternalSourceData *pRVar1;
  bool bVar2;
  HashElement *pHVar3;
  
  pHVar3 = (this->sourcelist).curhashelem;
  bVar2 = false;
  if (pHVar3 != (HashElement *)0x0) goto LAB_0012557e;
  pHVar3 = (HashElement *)0x0;
  while ((bVar2 == false && (pHVar3 != (HashElement *)0x0))) {
    pRVar1 = pHVar3->element;
    bVar2 = (bool)((pRVar1->super_RTPSourceData).packetlist.
                   super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
                   _M_impl._M_node.super__List_node_base._M_next !=
                   (_List_node_base *)&(pRVar1->super_RTPSourceData).packetlist &
                  (pRVar1->super_RTPSourceData).validated);
    if (bVar2 == false) {
LAB_0012557e:
      pHVar3 = pHVar3->listprev;
      (this->sourcelist).curhashelem = pHVar3;
    }
  }
  return bVar2;
}

Assistant:

inline void RTPKeyHashTable<Key,Element,GetIndex,hashsize>::GotoPreviousElement()
{
	if (curhashelem)
		curhashelem = curhashelem->listprev;
}